

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O1

void line_float(t_line_conflict *x,t_float f)

{
  double dVar1;
  double dVar2;
  t_float tVar3;
  
  dVar1 = clock_getsystime();
  if ((x->x_gotinlet == 0) || (x->x_in1val <= 0.0)) {
    clock_unset(x->x_clock);
    x->x_setval = f;
    x->x_targetval = f;
    outlet_float((x->x_obj).te_outlet,f);
  }
  else {
    if (dVar1 < x->x_targettime || dVar1 == x->x_targettime) {
      tVar3 = (t_float)((double)(x->x_targetval - x->x_setval) *
                        (dVar1 - x->x_prevtime) * x->x_1overtimediff + (double)x->x_setval);
    }
    else {
      tVar3 = x->x_targetval;
    }
    x->x_setval = tVar3;
    x->x_prevtime = dVar1;
    dVar2 = clock_getsystimeafter(x->x_in1val);
    x->x_targettime = dVar2;
    x->x_targetval = f;
    line_tick(x);
    x->x_gotinlet = 0;
    x->x_1overtimediff = 1.0 / (x->x_targettime - dVar1);
    if (x->x_grain <= 0.0) {
      x->x_grain = 20.0;
    }
    dVar1 = x->x_in1val;
    if ((double)x->x_grain <= x->x_in1val) {
      dVar1 = (double)x->x_grain;
    }
    clock_delay(x->x_clock,dVar1);
  }
  x->x_gotinlet = 0;
  return;
}

Assistant:

static void line_float(t_line *x, t_float f)
{
    double timenow = clock_getsystime();
    if (x->x_gotinlet && x->x_in1val > 0)
    {
        if (timenow > x->x_targettime) x->x_setval = x->x_targetval;
        else x->x_setval = x->x_setval + x->x_1overtimediff *
            (timenow - x->x_prevtime)
            * (x->x_targetval - x->x_setval);
        x->x_prevtime = timenow;
        x->x_targettime = clock_getsystimeafter(x->x_in1val);
        x->x_targetval = f;
        line_tick(x);
        x->x_gotinlet = 0;
        x->x_1overtimediff = 1./ (x->x_targettime - timenow);
        if (x->x_grain <= 0)
            x->x_grain = DEFAULTLINEGRAIN;
        clock_delay(x->x_clock,
            (x->x_grain > x->x_in1val ? x->x_in1val : x->x_grain));

    }
    else
    {
        clock_unset(x->x_clock);
        x->x_targetval = x->x_setval = f;
        outlet_float(x->x_obj.ob_outlet, f);
    }
    x->x_gotinlet = 0;
}